

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::ValidSameNameDifferentNamespaceTest(void)

{
  bool bVar1;
  IDLOptions local_2a58;
  Parser local_2748;
  IDLOptions local_1fc8;
  Parser local_1cb8;
  IDLOptions local_1538;
  Parser local_1228;
  IDLOptions local_a98;
  Parser local_788;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser(&local_788,&local_a98);
  bVar1 = Parser::Parse(&local_788,"namespace A; table X {} namespace B; table X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; table X {} namespace B; table X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x35a,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&local_a98);
  IDLOptions::IDLOptions(&local_1538);
  Parser::Parser(&local_1228,&local_1538);
  bVar1 = Parser::Parse(&local_1228,"namespace A; union X {} namespace B; union X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; union X {} namespace B; union X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x35d,"");
  Parser::~Parser(&local_1228);
  IDLOptions::~IDLOptions(&local_1538);
  IDLOptions::IDLOptions(&local_1fc8);
  Parser::Parser(&local_1cb8,&local_1fc8);
  bVar1 = Parser::Parse(&local_1cb8,"namespace A; table X {} namespace B; union X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; table X {} namespace B; union X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x360,"");
  Parser::~Parser(&local_1cb8);
  IDLOptions::~IDLOptions(&local_1fc8);
  IDLOptions::IDLOptions(&local_2a58);
  Parser::Parser(&local_2748,&local_2a58);
  bVar1 = Parser::Parse(&local_2748,"namespace A; union X {} namespace B; table X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; union X {} namespace B; table X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x362,"");
  Parser::~Parser(&local_2748);
  IDLOptions::~IDLOptions(&local_2a58);
  return;
}

Assistant:

void ValidSameNameDifferentNamespaceTest() {
  // Duplicate table names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; table X {} namespace B; table X {}"));
  // Duplicate union names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; union X {} namespace B; union X {}"));
  // Clashing table and union names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; table X {} namespace B; union X {}"));
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; union X {} namespace B; table X {}"));
}